

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Butterworth.cpp
# Opt level: O0

void __thiscall
Iir::Butterworth::HighPassBase::setup(HighPassBase *this,int order,double cutoffFrequency)

{
  undefined4 in_stack_00000018;
  int in_stack_0000003c;
  AnalogLowPass *in_stack_00000040;
  LayoutBase *in_stack_00000098;
  LayoutBase *in_stack_000000a0;
  double in_stack_000000a8;
  HighPassTransform *in_stack_000000b0;
  
  AnalogLowPass::design(in_stack_00000040,in_stack_0000003c);
  HighPassTransform::HighPassTransform
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  Cascade::setLayout((Cascade *)this,(LayoutBase *)CONCAT44(order,in_stack_00000018));
  return;
}

Assistant:

void HighPassBase::setup (int order,
                          double cutoffFrequency)
{
  m_analogProto.design (order);

  HighPassTransform (cutoffFrequency,
                     m_digitalProto,
                     m_analogProto);

  Cascade::setLayout (m_digitalProto);
}